

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate2.hpp
# Opt level: O2

void __thiscall
qclab::qgates::QRotationGate2<std::complex<float>_>::QRotationGate2
          (QRotationGate2<std::complex<float>_> *this,int qubit0,int qubit1,real_type cos,
          real_type sin,bool fixed)

{
  int qubits [2];
  int local_8;
  int local_4;
  
  (this->super_QAdjustable).fixed_ = fixed;
  (this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_004cec98;
  (this->rotation_).angle_.cos_ = cos;
  (this->rotation_).angle_.sin_ = sin;
  _local_8 = CONCAT44(qubit1,qubit0);
  setQubits(this,&local_8);
  return;
}

Assistant:

QRotationGate2( const int qubit0 , const int qubit1 ,
                        const real_type cos , const real_type sin ,
                        const bool fixed = false )
        : rotation_( cos , sin )
        , QAdjustable( fixed )
        {
          const int qubits[] = { qubit0 , qubit1 } ;
          setQubits( &qubits[0] ) ;
        }